

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void strings_equal<wchar_t>
               (string *n_c,string *n_original,string *iexpected,locale *l,string *domain)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  runtime_error *this;
  string *s;
  int iVar7;
  locale *in_RCX;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss_2;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss_1;
  locale tmp_locale;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  string_type tmp;
  locale tmp_locale_1;
  wchar_t *context_c_str;
  wchar_t *original_c_str;
  string_type c;
  string_type original;
  string_type expected;
  basic_message<wchar_t> *in_stack_fffffffffffff108;
  basic_message<wchar_t> *in_stack_fffffffffffff110;
  allocator *paVar8;
  basic_message<wchar_t> *in_stack_fffffffffffff118;
  runtime_error *in_stack_fffffffffffff120;
  string *in_stack_fffffffffffff128;
  undefined7 in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff137;
  basic_message<wchar_t> *in_stack_fffffffffffff138;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_fffffffffffff140;
  string *in_stack_fffffffffffff150;
  basic_message<wchar_t> *in_stack_fffffffffffff158;
  locale *in_stack_fffffffffffff160;
  string *in_stack_fffffffffffff168;
  allocator local_cf1;
  string local_cf0 [32];
  wstring local_cd0 [192];
  locale local_c10;
  wostringstream local_c08 [382];
  undefined1 local_a8a;
  allocator local_a89;
  string local_a88 [32];
  wstring local_a68 [192];
  locale local_9a8;
  wostringstream local_9a0 [376];
  locale local_828;
  undefined1 local_81a;
  allocator local_819;
  string local_818 [160];
  wstring local_778 [32];
  locale local_758;
  locale local_750;
  undefined1 local_742;
  allocator local_741;
  string local_740 [160];
  wstring local_6a0 [38];
  undefined1 local_67a;
  allocator local_679;
  string local_678 [32];
  wstring local_658 [160];
  locale local_5b8;
  wostringstream local_5b0 [376];
  locale local_438;
  undefined1 local_42a;
  allocator local_429;
  string local_428 [160];
  wstring local_388 [38];
  undefined1 local_362;
  allocator local_361;
  string local_360 [160];
  wstring local_2c0 [32];
  locale local_2a0;
  locale local_298;
  undefined1 local_28a;
  allocator local_289;
  string local_288 [160];
  wstring local_1e8 [32];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [160];
  wstring local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  wstring local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  wstring local_80 [48];
  locale local_50;
  wstring local_48 [72];
  
  std::locale::locale(&local_50,in_RCX);
  to_correct_string<wchar_t>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  std::locale::~locale(&local_50);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar4,&local_a1);
  to<wchar_t>((string *)in_stack_fffffffffffff138);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar4,&local_e9);
  to<wchar_t>((string *)in_stack_fffffffffffff138);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108);
  if (bVar1) {
    test_counter = test_counter + 1;
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff118,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff110);
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              (in_stack_fffffffffffff118,(locale *)in_stack_fffffffffffff110);
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff128);
    std::__cxx11::wstring::~wstring(local_110);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa9);
      poVar5 = std::operator<<(poVar5," bl::translate(c,original).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_1b2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1b0,"Error limits reached, stopping unit test",&local_1b1);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
        local_1b2 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    local_1c0 = std::__cxx11::wstring::c_str();
    local_1c8 = std::__cxx11::wstring::c_str();
    test_counter = test_counter + 1;
    booster::locale::translate<wchar_t>
              (&in_stack_fffffffffffff118->n_,&in_stack_fffffffffffff110->n_);
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              (in_stack_fffffffffffff118,(locale *)in_stack_fffffffffffff110);
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff128);
    std::__cxx11::wstring::~wstring(local_1e8);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xac);
      poVar5 = std::operator<<(poVar5,
                               " bl::translate(context_c_str,original_c_str).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_28a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_288,"Error limits reached, stopping unit test",&local_289);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
        local_28a = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::locale(&local_298);
    std::locale::global(&local_2a0);
    std::locale::~locale(&local_2a0);
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff118,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff110);
    booster::locale::basic_message::operator_cast_to_wstring(in_stack_fffffffffffff108);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
    test_counter = test_counter + 1;
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff128);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb0);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_362 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_360,"Error limits reached, stopping unit test",&local_361);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
        local_362 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff118,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff110);
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_(in_stack_fffffffffffff138);
    std::__cxx11::wstring::operator=(local_2c0,local_388);
    std::__cxx11::wstring::~wstring(local_388);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
    test_counter = test_counter + 1;
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff128);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb2);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_42a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_428,"Error limits reached, stopping unit test",&local_429);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
        local_42a = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::global(&local_438);
    std::locale::~locale(&local_438);
    std::__cxx11::wostringstream::wostringstream(local_5b0);
    std::wios::imbue(&local_5b8);
    std::locale::~locale(&local_5b8);
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff118,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff110);
    booster::locale::operator<<
              ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_fffffffffffff110,
               in_stack_fffffffffffff108);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
    test_counter = test_counter + 1;
    std::__cxx11::wostringstream::str();
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff128);
    std::__cxx11::wstring::~wstring(local_658);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb8);
      poVar5 = std::operator<<(poVar5," ss.str()==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_67a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_678,"Error limits reached, stopping unit test",&local_679);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
        local_67a = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::wostringstream::~wostringstream(local_5b0);
    std::__cxx11::wstring::~wstring(local_2c0);
    std::locale::~locale(&local_298);
  }
  test_counter = test_counter + 1;
  booster::locale::translate<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff118,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff110);
  booster::locale::basic_message<wchar_t>::str
            (in_stack_fffffffffffff138,
             (locale *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
             in_stack_fffffffffffff128);
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff128);
  std::__cxx11::wstring::~wstring(local_6a0);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xba);
    poVar5 = std::operator<<(poVar5," bl::translate(c,original).str(l,domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_742 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_740,"Error limits reached, stopping unit test",&local_741);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
      local_742 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_750);
  std::locale::global(&local_758);
  std::locale::~locale(&local_758);
  test_counter = test_counter + 1;
  booster::locale::translate<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff118,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff110);
  booster::locale::basic_message<wchar_t>::str(in_stack_fffffffffffff158,in_stack_fffffffffffff150);
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff128);
  std::__cxx11::wstring::~wstring(local_778);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbd);
    poVar5 = std::operator<<(poVar5," bl::translate(c,original).str(domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_81a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_818,"Error limits reached, stopping unit test",&local_819);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
      local_81a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_828);
  std::locale::~locale(&local_828);
  std::__cxx11::wostringstream::wostringstream(local_9a0);
  std::wios::imbue(&local_9a8);
  std::locale::~locale(&local_9a8);
  booster::locale::as::domain((string *)in_stack_fffffffffffff118);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff140,(set_domain *)in_stack_fffffffffffff138);
  booster::locale::translate<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff118,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff110);
  booster::locale::operator<<
            ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_fffffffffffff110,
             in_stack_fffffffffffff108);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x1243f1);
  test_counter = test_counter + 1;
  std::__cxx11::wostringstream::str();
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff128);
  std::__cxx11::wstring::~wstring(local_a68);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc3);
    poVar5 = std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a8a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      paVar8 = &local_a89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a88,"Error limits reached, stopping unit test",paVar8);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff120,(string *)in_stack_fffffffffffff118);
      local_a8a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream(local_9a0);
  std::__cxx11::wostringstream::wostringstream(local_c08);
  std::wios::imbue(&local_c10);
  std::locale::~locale(&local_c10);
  booster::locale::as::domain((string *)in_stack_fffffffffffff118);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff140,(set_domain *)in_stack_fffffffffffff138);
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  booster::locale::translate<wchar_t>(&in_stack_fffffffffffff118->n_,&in_stack_fffffffffffff110->n_)
  ;
  booster::locale::operator<<
            ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_fffffffffffff110,
             in_stack_fffffffffffff108);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff110);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x1246f3);
  test_counter = test_counter + 1;
  std::__cxx11::wostringstream::str();
  bVar3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff128);
  std::__cxx11::wstring::~wstring(local_cd0);
  if ((bVar3 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    this = (runtime_error *)std::ostream::operator<<(poVar5,0xc9);
    s = (string *)std::operator<<((ostream *)this," ss.str()==expected");
    std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      uVar6 = __cxa_allocate_exception(0x30);
      paVar8 = &local_cf1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cf0,"Error limits reached, stopping unit test",paVar8);
      booster::runtime_error::runtime_error(this,s);
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream(local_c08);
  std::locale::~locale(&local_750);
  std::__cxx11::wstring::~wstring(local_c8);
  std::__cxx11::wstring::~wstring(local_80);
  std::__cxx11::wstring::~wstring(local_48);
  return;
}

Assistant:

void strings_equal(std::string n_c,std::string n_original,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type original = to<Char>(n_original.c_str());
    string_type c = to<Char>(n_c.c_str());
    if(domain=="default") {
        TEST(bl::translate(c,original).str(l)==expected);
        Char const *original_c_str=original.c_str(); // workaround gcc-3.4 bug
        Char const *context_c_str = c.c_str();
        TEST(bl::translate(context_c_str,original_c_str).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(c,original);
        TEST(tmp==expected);
        tmp=bl::translate(c,original).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(c,original);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(c,original).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(c,original).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c,original);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c.c_str(),original.c_str());
        TEST(ss.str()==expected);
    }
}